

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall ON_SubD::RemoveEdgeVertexConnection(ON_SubD *this,ON_SubDEdge *e,ON_SubDVertex *v)

{
  ON_SubDVertex *v_local;
  ON_SubDEdge *e_local;
  ON_SubD *this_local;
  
  if ((e == (ON_SubDEdge *)0x0) || (v == (ON_SubDVertex *)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    if (v == e->m_vertex[0]) {
      e->m_vertex[0] = (ON_SubDVertex *)0x0;
    }
    if (v == e->m_vertex[1]) {
      e->m_vertex[1] = (ON_SubDVertex *)0x0;
    }
    this_local._7_1_ = ON_SubDVertex::RemoveEdgeFromArray(v,e);
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubD::RemoveEdgeVertexConnection(
  ON_SubDEdge* e,
  ON_SubDVertex* v
)
{
  if (nullptr == e || nullptr == v)
    return false;
  if (v == e->m_vertex[0])
    e->m_vertex[0] = nullptr;
  if (v == e->m_vertex[1])
    e->m_vertex[1] = nullptr;
  return v->RemoveEdgeFromArray(e);
}